

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O2

bool deqp::gls::TextureStateQueryTests::anon_unknown_1::isCoreTextureTarget
               (ContextType *contextType,GLenum target)

{
  bool bVar1;
  
  bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x23);
  if (bVar1) {
    bVar1 = es31::isCoreTextureTarget(target);
    if (bVar1) {
      return true;
    }
    if (target == 0x8c2a) {
      return true;
    }
    if (target == 0x9009) {
      return true;
    }
    if (target == 0x9102) {
      return true;
    }
  }
  else {
    bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x13);
    if (bVar1) {
      bVar1 = es31::isCoreTextureTarget(target);
      return bVar1;
    }
    bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x3);
    if (bVar1) {
      bVar1 = es30::isCoreTextureTarget(target);
      return bVar1;
    }
  }
  return false;
}

Assistant:

static bool isCoreTextureTarget (const glu::ContextType& contextType, glw::GLenum target)
{
	if (contextSupports(contextType, glu::ApiType::es(3,2)))
		return es32::isCoreTextureTarget(target);
	else if (contextSupports(contextType, glu::ApiType::es(3,1)))
		return es31::isCoreTextureTarget(target);
	else if (contextSupports(contextType, glu::ApiType::es(3,0)))
		return es30::isCoreTextureTarget(target);
	else
	{
		DE_ASSERT(false);
		return DE_NULL;
	}
}